

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::init(CopyImageTest *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  RenderContext *context;
  bool bVar1;
  ContextType CVar2;
  GLSLVersion glslVersion;
  int extraout_EAX;
  SeedBuilder *builder_00;
  State *rnd;
  NotSupportedError *this_00;
  allocator<char> local_5d;
  SeedBuilder builder;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  string local_48;
  
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       glu::ContextInfo::create(((this->super_TestCase).m_context)->m_renderCtx);
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (ctxInfo.
                       super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                       m_data.ptr,"GL_EXT_copy_image");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Extension GL_EXT_copy_image not supported.",
                 glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                 ,0x784);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  checkFormatSupport(ctxInfo.
                     super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                     m_data.ptr,(this->m_srcImageInfo).m_format,(this->m_srcImageInfo).m_target,
                     ((this->super_TestCase).m_context)->m_renderCtx);
  checkFormatSupport(ctxInfo.
                     super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                     m_data.ptr,(this->m_dstImageInfo).m_format,(this->m_dstImageInfo).m_target,
                     ((this->super_TestCase).m_context)->m_renderCtx);
  tcu::SeedBuilder::SeedBuilder(&builder);
  builder_00 = tcu::operator<<(&builder,0xdcb2c);
  anon_unknown_0::operator<<(builder_00,&this->m_srcImageInfo);
  anon_unknown_0::operator<<(builder_00,&this->m_dstImageInfo);
  rnd = (State *)operator_new(0xf8);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  deRandom_init((deRandom *)rnd,builder.m_hash);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,glcts::fixed_sample_locations_values + 1,&local_5d);
  tcu::ResultCollector::ResultCollector(&rnd->results,log,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  rnd->srcImage = (ObjectWrapper *)0x0;
  rnd->dstImage = (ObjectWrapper *)0x0;
  CVar2.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])(context);
  glslVersion = glu::getContextTypeGLSLVersion(CVar2);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&rnd->textureRenderer,context,log,glslVersion,PRECISION_HIGHP);
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rnd->dstImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rnd->srcImageLevels).
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_state = rnd;
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
  return extraout_EAX;
}

Assistant:

void CopyImageTest::init (void)
{
	de::UniquePtr<glu::ContextInfo> ctxInfo(glu::ContextInfo::create(m_context.getRenderContext()));
	const bool						isES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!isES32 && !ctxInfo->isExtensionSupported("GL_EXT_copy_image"))
		throw tcu::NotSupportedError("Extension GL_EXT_copy_image not supported.", "", __FILE__, __LINE__);

	checkFormatSupport(*ctxInfo, m_srcImageInfo.getFormat(), m_srcImageInfo.getTarget(), m_context.getRenderContext());
	checkFormatSupport(*ctxInfo, m_dstImageInfo.getFormat(), m_dstImageInfo.getTarget(), m_context.getRenderContext());

	{
		SeedBuilder builder;

		builder << 903980
				<< m_srcImageInfo
				<< m_dstImageInfo;

		m_state = new State(builder.get(), m_testCtx.getLog(), m_context.getRenderContext());
	}
}